

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

string * __thiscall
cmsys::(anonymous_namespace)::SymbolProperties::Demangle_abi_cxx11_
          (string *__return_storage_ptr__,void *this,char *symbol)

{
  char *__ptr;
  char *local_58;
  char *demangledSymbol;
  int status;
  allocator<char> local_22;
  undefined1 local_21;
  char *local_20;
  char *symbol_local;
  SymbolProperties *this_local;
  string *result;
  
  local_21 = 0;
  local_58 = symbol;
  if (symbol == (char *)0x0) {
    local_58 = "???";
  }
  local_20 = symbol;
  symbol_local = (char *)this;
  this_local = (SymbolProperties *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_58,&local_22);
  std::allocator<char>::~allocator(&local_22);
  demangledSymbol._0_4_ = 0;
  __ptr = (char *)__cxa_demangle(local_20,0,0,&demangledSymbol);
  if ((int)demangledSymbol == 0) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,__ptr);
  }
  free(__ptr);
  return __return_storage_ptr__;
}

Assistant:

std::string SymbolProperties::Demangle(const char* symbol) const
{
  std::string result = safes(symbol);
#  if defined(KWSYS_SYSTEMINFORMATION_HAS_CPP_DEMANGLE)
  int status = 0;
  char* demangledSymbol =
    abi::__cxa_demangle(symbol, nullptr, nullptr, &status);
  if (!status) {
    result = demangledSymbol;
  }
  free(demangledSymbol);
#  else
  (void)symbol;
#  endif
  return result;
}